

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.h
# Opt level: O0

int __thiscall
sznet::TimerQueue::earliestExpiredTime(TimerQueue *this,Timestamp now,int defaultTimeMs)

{
  size_type sVar1;
  int local_20;
  int defaultTimeMs_local;
  TimerQueue *this_local;
  Timestamp now_local;
  
  sVar1 = std::
          set<std::pair<sznet::Timer_*,_long>,_std::less<std::pair<sznet::Timer_*,_long>_>,_std::allocator<std::pair<sznet::Timer_*,_long>_>_>
          ::size(&this->m_activeTimers);
  local_20 = defaultTimeMs;
  if (sVar1 != 0) {
    local_20 = 0;
  }
  return local_20;
}

Assistant:

inline int earliestExpiredTime(Timestamp now = Timestamp::now(), int defaultTimeMs = 0)
	{
#if 0
		Timer* timer = m_timerMinHeap.top();
		if (!timer)
		{
			return defaultTimeMs;
		}

		if (timer->expiration().microSecondsSinceEpoch() > now.microSecondsSinceEpoch())
		{
			return std::min(timeDifferenceMs(timer->expiration(), now), defaultTimeMs);
		}

		// 走到这里说明已经有超时的timer了
		return 0;
#else
		(void)now;
		return (m_activeTimers.size() > 0 ? 0 : defaultTimeMs);
#endif
	}